

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utFindInvalidData.cpp
# Opt level: O0

void __thiscall
utFindInvalidDataProcess_testStepNegativeResult_Test::
utFindInvalidDataProcess_testStepNegativeResult_Test
          (utFindInvalidDataProcess_testStepNegativeResult_Test *this)

{
  utFindInvalidDataProcess_testStepNegativeResult_Test *this_local;
  
  utFindInvalidDataProcess::utFindInvalidDataProcess(&this->super_utFindInvalidDataProcess);
  (this->super_utFindInvalidDataProcess).super_Test._vptr_Test =
       (_func_int **)&PTR__utFindInvalidDataProcess_testStepNegativeResult_Test_0103fa58;
  return;
}

Assistant:

TEST_F(utFindInvalidDataProcess, testStepNegativeResult) {
    ::memset(mMesh->mNormals, 0, mMesh->mNumVertices*sizeof(aiVector3D) );
    ::memset(mMesh->mBitangents, 0, mMesh->mNumVertices*sizeof(aiVector3D) );

    mMesh->mTextureCoords[2][455] = aiVector3D( std::numeric_limits<float>::quiet_NaN() );

    mProcess->ProcessMesh(mMesh);

    EXPECT_TRUE(NULL != mMesh->mVertices);
    EXPECT_EQ(NULL, mMesh->mNormals);
    EXPECT_EQ(NULL, mMesh->mTangents);
    EXPECT_EQ(NULL, mMesh->mBitangents);

    for (unsigned int i = 0; i < 2; ++i) {
        EXPECT_TRUE(NULL != mMesh->mTextureCoords[i]);
    }

    for (unsigned int i = 2; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
        EXPECT_EQ(NULL, mMesh->mTextureCoords[i]);
    }
}